

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O3

void __thiscall
tchecker::zg::zg_t::final
          (zg_t *this,final_value_t *final_edge,
          vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
          *v,state_status_t mask)

{
  state_status_t sVar1;
  char *__function;
  transition_sptr_t t;
  state_sptr_t s;
  tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
  local_48;
  
  details::
  state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
  construct<>((state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
               *)&s);
  syncprod::details::
  transition_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
  ::construct<>((transition_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
                 *)&t);
  if (s._t == (make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)0x0) {
    __function = 
    "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::zg::state_t>]"
    ;
  }
  else {
    if (t._t != (make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL> *)0x0) {
      sVar1 = zg::final((this->_system).
                        super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,(vloc_sptr_t *)s._t,&((s._t)->super_state_t).super_state_t._intval,
                        &((s._t)->super_state_t)._zone,
                        &((t._t)->super_transition_t).super_transition_t.super_transition_t._vedge,
                        (sync_id_t *)t._t,
                        &((t._t)->super_transition_t).super_transition_t._tgt_invariant,
                        (this->_semantics).
                        super___shared_ptr<tchecker::zg::semantics_t,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(this->_extrapolation).
                               super___shared_ptr<tchecker::zg::extrapolation_t,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,final_edge);
      if ((sVar1 & mask) != 0) {
        if (this->_sharing_type == SHARING) {
          details::
          state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
          ::share(&(this->_state_allocator).
                   super_state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                  ,&s);
          syncprod::details::
          transition_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
          ::share((transition_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
                   *)&this->_transition_allocator,&t);
        }
        std::
        _Tuple_impl<1ul,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>>>
        ::
        _Tuple_impl<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>&,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>>&,void>
                  ((_Tuple_impl<1ul,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>>>
                    *)&local_48,&s,&t);
        local_48.
        super__Tuple_impl<0UL,_unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
        .super__Head_base<0UL,_unsigned_int,_false>._M_head_impl = sVar1;
        std::
        vector<std::tuple<unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>>>,std::allocator<std::tuple<unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>>>>>
        ::
        emplace_back<std::tuple<unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>>>>
                  ((vector<std::tuple<unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>>>,std::allocator<std::tuple<unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>>>>>
                    *)v,&local_48);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t
                  (&local_48.
                    super__Tuple_impl<0UL,_unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
                    .
                    super__Tuple_impl<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
                    .
                    super__Head_base<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_false>
                    ._M_head_impl);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t
                  ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
                    *)&local_48);
      }
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&t);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
      ~intrusive_shared_ptr_t(&s);
      return;
    }
    __function = 
    "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::zg::transition_t>]"
    ;
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1d0,__function);
}

Assistant:

void zg_t::final(final_value_t const & final_edge, std::vector<sst_t> & v, tchecker::state_status_t mask)
{
  tchecker::zg::state_sptr_t s = _state_allocator.construct();
  tchecker::zg::transition_sptr_t t = _transition_allocator.construct();
  tchecker::state_status_t status = tchecker::zg::final(*_system, *s, *t, *_semantics, *_extrapolation, final_edge);
  if (status & mask) {
    if (_sharing_type == tchecker::ts::SHARING) {
      share(s);
      share(t);
    }
    v.push_back(std::make_tuple(status, s, t));
  }
}